

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_PermutationElement_Test::TestBody(Sampling_PermutationElement_Test *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  char *in_R9;
  ulong uVar7;
  uint32_t w;
  size_type __n;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertHelper local_98;
  allocator_type local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_80;
  vector<bool,_std::allocator<bool>_> local_60;
  ulong local_38;
  
  __n = 2;
  do {
    uVar3 = (int)__n - 1;
    uVar6 = 0;
    uVar3 = uVar3 >> 1 | uVar3;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    uVar3 = uVar3 >> 0x10 | uVar3;
    do {
      local_80._M_dataplus._M_p._0_1_ = 0;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_60,__n,(bool *)&local_80,local_90);
      uVar5 = 0;
      uVar7 = uVar5;
      do {
        do {
          uVar4 = ((uint)uVar5 ^ uVar6) * -0x1e8f76c3;
          uVar4 = ((uVar4 & uVar3) >> 4 ^ uVar4) * 0x929eb3f;
          uVar4 = ((uVar4 & uVar3) >> 1 ^ uVar4) * 0x6935fa69;
          uVar4 = ((uVar4 & uVar3) >> 0xb ^ uVar4) * 0x74dcb303;
          uVar4 = ((uVar4 & uVar3) >> 2 ^ uVar4) * -0x61afe33d;
          uVar4 = ((uVar4 & uVar3) >> 2 ^ uVar4) * -0x379f5c21 & uVar3;
          uVar4 = uVar4 >> 5 ^ uVar4;
          uVar5 = (ulong)uVar4;
        } while (__n <= uVar5);
        uVar1 = (ulong)(uVar4 + uVar6) % (__n & 0xffffffff);
        uVar5 = (ulong)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                ((long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        local_90[0] = (allocator_type)(uVar1 < uVar5);
        local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (uVar5 <= uVar1) {
          testing::Message::Message((Message *)&local_a0);
          std::ostream::operator<<((ostream *)(local_a0.ptr_ + 0x10),(int)uVar1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_80,(internal *)local_90,
                     (AssertionResult *)"offset >= 0 && offset < seen.size()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x3e1,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_));
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_
                                    ),local_80.field_2._M_allocated_capacity + 1);
          }
          if (((local_a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_a0.ptr_ + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p == (_Bit_type *)0x0) {
            return;
          }
          operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_90[0] = (allocator_type)
                      ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6]
                        >> (uVar1 & 0x3f) & 1) == 0);
        local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_90[0]) {
          testing::Message::Message((Message *)&local_a0);
          local_38 = uVar7;
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_80,(internal *)local_90,(AssertionResult *)"seen[offset]","true","false"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x3e2,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_));
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_
                                    ),local_80.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_38;
          if (((local_a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_a0.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar5 = (ulong)((int)uVar7 + 1);
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] =
             local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] | 1L << (uVar1 & 0x3f);
        uVar7 = uVar5;
      } while (__n != uVar5);
      operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 10);
    __n = __n + 1;
    if (__n == 0x400) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Sampling, PermutationElement) {
    for (int len = 2; len < 1024; ++len) {
        for (int iter = 0; iter < 10; ++iter) {
            std::vector<bool> seen(len, false);

            for (int i = 0; i < len; ++i) {
                int offset = PermutationElement(i, len, iter);
                ASSERT_TRUE(offset >= 0 && offset < seen.size()) << offset;
                EXPECT_FALSE(seen[offset]);
                seen[offset] = true;
            }
        }
    }
}